

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeStateApiTests.cpp
# Opt level: O2

void deqp::gles31::Functional::NegativeTestShared::get_uniformuiv(NegativeTestContext *ctx)

{
  RenderContext *renderCtx;
  GLint location;
  GLuint program_00;
  GLuint program_01;
  allocator<char> local_24a;
  allocator<char> local_249;
  GLuint params [4];
  string local_220;
  string local_200;
  string local_1e0;
  ProgramSources local_1c0;
  ShaderProgram program;
  
  renderCtx = ctx->m_renderCtx;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1e0,
             "${GLSL_VERSION_DECL}\nuniform mediump vec4 vUnif_vec4;\nin mediump vec4 attr;layout(shared) uniform Block { mediump vec4 blockVar; };\nvoid main (void)\n{\n\tgl_Position = vUnif_vec4 + blockVar + attr;\n}\n"
             ,&local_249);
  getVtxFragVersionSources((string *)params,&local_1e0,ctx);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_200,
             "${GLSL_VERSION_DECL}\nuniform mediump ivec4 fUnif_ivec4;\nuniform mediump uvec4 fUnif_uvec4;\nlayout(location = 0) out mediump vec4 fragColor;void main (void)\n{\n\tfragColor = vec4(vec4(fUnif_ivec4) + vec4(fUnif_uvec4));\n}\n"
             ,&local_24a);
  getVtxFragVersionSources(&local_220,&local_200,ctx);
  glu::makeVtxFragSources(&local_1c0,(string *)params,&local_220);
  glu::ShaderProgram::ShaderProgram(&program,renderCtx,&local_1c0);
  glu::ProgramSources::~ProgramSources(&local_1c0);
  std::__cxx11::string::~string((string *)&local_220);
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::~string((string *)params);
  std::__cxx11::string::~string((string *)&local_1e0);
  location = glu::CallLogWrapper::glGetUniformLocation
                       (&ctx->super_CallLogWrapper,program.m_program.m_program,"fUnif_uvec4");
  params[0] = 0;
  params[1] = 0;
  params[2] = 0;
  params[3] = 0;
  glu::CallLogWrapper::glUseProgram(&ctx->super_CallLogWrapper,program.m_program.m_program);
  if (location == -1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1c0,"Failed to retrieve uniform location",
               (allocator<char> *)&local_220);
    NegativeTestContext::fail(ctx,(string *)&local_1c0);
    std::__cxx11::string::~string((string *)&local_1c0);
  }
  program_00 = glu::CallLogWrapper::glCreateShader(&ctx->super_CallLogWrapper,0x8b31);
  program_01 = glu::CallLogWrapper::glCreateProgram(&ctx->super_CallLogWrapper);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c0,
             "GL_INVALID_VALUE is generated if program is not a value generated by OpenGL.",
             (allocator<char> *)&local_220);
  NegativeTestContext::beginSection(ctx,(string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_1c0);
  glu::CallLogWrapper::glGetUniformuiv(&ctx->super_CallLogWrapper,0xffffffff,location,params);
  NegativeTestContext::expectError(ctx,0x501);
  NegativeTestContext::endSection(ctx);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c0,
             "GL_INVALID_OPERATION is generated if program is not a program object.",
             (allocator<char> *)&local_220);
  NegativeTestContext::beginSection(ctx,(string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_1c0);
  glu::CallLogWrapper::glGetUniformuiv(&ctx->super_CallLogWrapper,program_00,location,params);
  NegativeTestContext::expectError(ctx,0x502);
  NegativeTestContext::endSection(ctx);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c0,
             "GL_INVALID_OPERATION is generated if program has not been successfully linked.",
             (allocator<char> *)&local_220);
  NegativeTestContext::beginSection(ctx,(string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_1c0);
  glu::CallLogWrapper::glGetUniformuiv(&ctx->super_CallLogWrapper,program_01,location,params);
  NegativeTestContext::expectError(ctx,0x502);
  NegativeTestContext::endSection(ctx);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c0,
             "GL_INVALID_OPERATION is generated if location does not correspond to a valid uniform variable location for the specified program object."
             ,(allocator<char> *)&local_220);
  NegativeTestContext::beginSection(ctx,(string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_1c0);
  glu::CallLogWrapper::glGetUniformuiv
            (&ctx->super_CallLogWrapper,program.m_program.m_program,-1,params);
  NegativeTestContext::expectError(ctx,0x502);
  NegativeTestContext::endSection(ctx);
  glu::CallLogWrapper::glDeleteShader(&ctx->super_CallLogWrapper,program_00);
  glu::CallLogWrapper::glDeleteProgram(&ctx->super_CallLogWrapper,program_01);
  glu::ShaderProgram::~ShaderProgram(&program);
  return;
}

Assistant:

void get_uniformuiv (NegativeTestContext& ctx)
{
	glu::ShaderProgram	program			(ctx.getRenderContext(), glu::makeVtxFragSources(getVtxFragVersionSources(uniformTestVertSource, ctx), getVtxFragVersionSources(uniformTestFragSource, ctx)));
	GLint				unif			= ctx.glGetUniformLocation(program.getProgram(), "fUnif_uvec4");
	GLuint				params[4]		= { 0, 0, 0, 0 };
	GLuint				shader;
	GLuint				programEmpty;

	ctx.glUseProgram(program.getProgram());

	if (unif == -1)
		ctx.fail("Failed to retrieve uniform location");

	shader = ctx.glCreateShader(GL_VERTEX_SHADER);
	programEmpty = ctx.glCreateProgram();

	ctx.beginSection("GL_INVALID_VALUE is generated if program is not a value generated by OpenGL.");
	ctx.glGetUniformuiv (-1, unif, &params[0]);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_OPERATION is generated if program is not a program object.");
	ctx.glGetUniformuiv (shader, unif, &params[0]);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_OPERATION is generated if program has not been successfully linked.");
	ctx.glGetUniformuiv (programEmpty, unif, &params[0]);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_OPERATION is generated if location does not correspond to a valid uniform variable location for the specified program object.");
	ctx.glGetUniformuiv (program.getProgram(), -1, &params[0]);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.endSection();

	ctx.glDeleteShader(shader);
	ctx.glDeleteProgram(programEmpty);
}